

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

mp_int * BinarySource_get_mp_ssh2(BinarySource *src)

{
  ptrlen bytes_00;
  uchar *p;
  ptrlen bytes;
  BinarySource *src_local;
  
  bytes_00 = BinarySource_get_string(src->binarysource_);
  if (src->binarysource_->err == BSE_NO_ERROR) {
    p = (uchar *)bytes_00.ptr;
    bytes.ptr = (void *)bytes_00.len;
    if ((bytes.ptr == (void *)0x0) ||
       (((*p & 0x80) == 0 && ((*p != '\0' || (((void *)0x1 < bytes.ptr && ((p[1] & 0x80) != 0)))))))
       ) {
      src_local = (BinarySource *)mp_from_bytes_be(bytes_00);
    }
    else {
      src->err = BSE_INVALID;
      src_local = (BinarySource *)mp_from_integer(0);
    }
  }
  else {
    src_local = (BinarySource *)mp_from_integer(0);
  }
  return (mp_int *)src_local;
}

Assistant:

mp_int *BinarySource_get_mp_ssh2(BinarySource *src)
{
    ptrlen bytes = get_string(src);
    if (get_err(src)) {
        return mp_from_integer(0);
    } else {
        const unsigned char *p = bytes.ptr;
        if ((bytes.len > 0 &&
             ((p[0] & 0x80) ||
              (p[0] == 0 && (bytes.len <= 1 || !(p[1] & 0x80)))))) {
            src->err = BSE_INVALID;
            return mp_from_integer(0);
        }
        return mp_from_bytes_be(bytes);
    }
}